

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_fixture.c
# Opt level: O3

REF_STATUS ref_fixture_pri_grid(REF_GRID_conflict *ref_grid_ptr,REF_MPI ref_mpi)

{
  REF_GRID_conflict pRVar1;
  REF_NODE ref_node;
  REF_DBL *pRVar2;
  REF_DBL *pRVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined8 uVar8;
  int iVar9;
  REF_INT RVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  char *pcVar14;
  REF_INT cell;
  REF_INT local [27];
  REF_INT local_9c;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  int local_84 [23];
  
  uVar4 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar4 != 0) {
    pcVar14 = "create";
    uVar8 = 0x25a;
    goto LAB_00120dc5;
  }
  pRVar1 = *ref_grid_ptr;
  ref_node = pRVar1->node;
  pRVar1->twod = 0;
  iVar6 = ref_mpi->n;
  iVar7 = ref_mpi->id;
  iVar9 = 0;
  iVar5 = (int)(5 / (long)iVar6);
  iVar12 = iVar5 * iVar6;
  if (5 < iVar12) {
    iVar9 = ((((iVar6 + 5) / iVar6) * (iVar12 + -6)) / iVar5 - iVar12) + 6;
  }
  if (iVar7 == iVar9) {
LAB_0012065e:
    uVar4 = ref_node_add(ref_node,0,&local_98);
    if (uVar4 != 0) {
      pcVar14 = "add node";
      uVar8 = 0x272;
      goto LAB_00120dc5;
    }
    pRVar2 = ref_node->real;
    lVar13 = (long)local_98;
    pRVar3 = pRVar2 + lVar13 * 0xf;
    *pRVar3 = 0.0;
    pRVar3[1] = 0.0;
    pRVar2[lVar13 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_98 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 5) / iVar6;
    if (lVar11 / (long)iVar7 < (long)(ulong)((int)(5 % (long)iVar6) + 1)) {
      lVar11 = -1;
      if ((-1 < local_98) && (local_98 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar7);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_98) && (local_98 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar5 = (int)(5 / (long)iVar6);
      iVar6 = 6 - iVar6 * iVar5;
      RVar10 = iVar6 + (int)((lVar11 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_node_add(ref_node,1,&local_94);
    if (uVar4 != 0) {
      pcVar14 = "add node";
      uVar8 = 0x273;
      goto LAB_00120dc5;
    }
    pRVar2 = ref_node->real;
    lVar13 = (long)local_94;
    pRVar3 = pRVar2 + lVar13 * 0xf;
    *pRVar3 = 0.0;
    pRVar3[1] = 0.0;
    pRVar2[lVar13 * 0xf + 2] = 1.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_94 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 5) / iVar6;
    if (lVar11 / (long)iVar7 < (long)(ulong)((int)(5 % (long)iVar6) + 1)) {
      lVar11 = -1;
      if ((-1 < local_94) && (local_94 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar7);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_94) && (local_94 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar5 = (int)(5 / (long)iVar6);
      iVar6 = 6 - iVar6 * iVar5;
      RVar10 = iVar6 + (int)((lVar11 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_node_add(ref_node,2,&local_90);
    if (uVar4 != 0) {
      pcVar14 = "add node";
      uVar8 = 0x274;
      goto LAB_00120dc5;
    }
    pRVar3 = ref_node->real;
    lVar13 = (long)local_90;
    pRVar3[lVar13 * 0xf] = 1.0;
    pRVar3 = pRVar3 + lVar13 * 0xf + 1;
    *pRVar3 = 0.0;
    pRVar3[1] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_90 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 5) / iVar6;
    if (lVar11 / (long)iVar7 < (long)(ulong)((int)(5 % (long)iVar6) + 1)) {
      lVar11 = -1;
      if ((-1 < local_90) && (local_90 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar7);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_90) && (local_90 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar5 = (int)(5 / (long)iVar6);
      iVar6 = 6 - iVar6 * iVar5;
      RVar10 = iVar6 + (int)((lVar11 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_node_add(ref_node,3,&local_8c);
    if (uVar4 != 0) {
      pcVar14 = "add node";
      uVar8 = 0x275;
      goto LAB_00120dc5;
    }
    pRVar2 = ref_node->real;
    lVar13 = (long)local_8c;
    pRVar3 = pRVar2 + lVar13 * 0xf;
    *(undefined4 *)pRVar3 = 0;
    *(undefined4 *)((long)pRVar3 + 4) = 0;
    *(undefined4 *)(pRVar3 + 1) = 0;
    *(undefined4 *)((long)pRVar3 + 0xc) = 0x3ff00000;
    pRVar2[lVar13 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_8c < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 5) / iVar6;
    if (lVar11 / (long)iVar7 < (long)(ulong)((int)(5 % (long)iVar6) + 1)) {
      lVar11 = -1;
      if ((-1 < local_8c) && (local_8c < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar7);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_8c) && (local_8c < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar5 = (int)(5 / (long)iVar6);
      iVar6 = 6 - iVar6 * iVar5;
      RVar10 = iVar6 + (int)((lVar11 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_node_add(ref_node,4,&local_88);
    if (uVar4 != 0) {
      pcVar14 = "add node";
      uVar8 = 0x276;
      goto LAB_00120dc5;
    }
    pRVar2 = ref_node->real;
    lVar13 = (long)local_88;
    pRVar3 = pRVar2 + lVar13 * 0xf;
    *(undefined4 *)pRVar3 = 0;
    *(undefined4 *)((long)pRVar3 + 4) = 0;
    *(undefined4 *)(pRVar3 + 1) = 0;
    *(undefined4 *)((long)pRVar3 + 0xc) = 0x3ff00000;
    pRVar2[lVar13 * 0xf + 2] = 1.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_88 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 5) / iVar6;
    if (lVar11 / (long)iVar7 < (long)(ulong)((int)(5 % (long)iVar6) + 1)) {
      lVar11 = -1;
      if ((-1 < local_88) && (local_88 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar7);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_88) && (local_88 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar5 = (int)(5 / (long)iVar6);
      iVar6 = 6 - iVar6 * iVar5;
      RVar10 = iVar6 + (int)((lVar11 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_node_add(ref_node,5,local_84);
    if (uVar4 != 0) {
      pcVar14 = "add node";
      uVar8 = 0x277;
      goto LAB_00120dc5;
    }
    pRVar2 = ref_node->real;
    lVar13 = (long)local_84[0];
    pRVar3 = pRVar2 + lVar13 * 0xf;
    *pRVar3 = 1.0;
    pRVar3[1] = 1.0;
    pRVar2[lVar13 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_84[0] < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 5) / iVar6;
    if (lVar11 / (long)iVar7 < (long)(ulong)((int)(5 % (long)iVar6) + 1)) {
      lVar11 = -1;
      if ((-1 < local_84[0]) && (local_84[0] < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar7);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_84[0]) && (local_84[0] < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar5 = (int)(5 / (long)iVar6);
      iVar6 = 6 - iVar6 * iVar5;
      RVar10 = iVar6 + (int)((lVar11 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_cell_add(pRVar1->cell[10],&local_98,&local_9c);
    if (uVar4 != 0) {
      pcVar14 = "add prism";
      uVar8 = 0x279;
      goto LAB_00120dc5;
    }
  }
  else {
    iVar6 = (iVar6 + 5) / iVar6;
    iVar9 = 0;
    if (iVar6 + 1U < 3) {
      iVar9 = iVar6;
    }
    iVar12 = 6 - iVar12;
    if (iVar12 <= iVar9) {
      iVar9 = (1 - iVar6 * iVar12) / iVar5 + iVar12;
    }
    if (iVar7 == iVar9) goto LAB_0012065e;
    iVar9 = (int)(2 / (long)iVar6);
    if (iVar12 <= iVar9) {
      iVar9 = (2 - iVar6 * iVar12) / iVar5 + iVar12;
    }
    if (iVar7 == iVar9) goto LAB_0012065e;
    iVar9 = (int)(3 / (long)iVar6);
    if (iVar12 <= iVar9) {
      iVar9 = (3 - iVar6 * iVar12) / iVar5 + iVar12;
    }
    if (iVar7 == iVar9) goto LAB_0012065e;
    iVar9 = (int)(4 / (long)iVar6);
    if (iVar12 <= iVar9) {
      iVar9 = (4 - iVar6 * iVar12) / iVar5 + iVar12;
    }
    if (iVar7 == iVar9) goto LAB_0012065e;
    iVar9 = (int)(5 / (long)iVar6);
    if (iVar12 <= iVar9) {
      iVar9 = (5 - iVar6 * iVar12) / iVar5 + iVar12;
    }
    if (iVar7 == iVar9) goto LAB_0012065e;
  }
  uVar4 = ref_node_initialize_n_global(ref_node,6);
  if (uVar4 == 0) {
    return 0;
  }
  pcVar14 = "init glob";
  uVar8 = 0x27c;
LAB_00120dc5:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",uVar8,
         "ref_fixture_pri_grid",(ulong)uVar4,pcVar14);
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_fixture_pri_grid(REF_GRID *ref_grid_ptr,
                                        REF_MPI ref_mpi) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_INT global[REF_CELL_MAX_SIZE_PER];
  REF_INT local[REF_CELL_MAX_SIZE_PER];
  REF_INT cell;
  REF_INT nnodesg = 6;

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create");
  ref_grid = *ref_grid_ptr;
  ref_node = ref_grid_node(ref_grid);

  ref_grid_twod(ref_grid) = REF_FALSE;

  global[0] = 0;
  global[1] = 1;
  global[2] = 2;
  global[3] = 3;
  global[4] = 4;
  global[5] = 5;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[4]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[5])) {
    add_that_node(0, 0.0, 0.0, 0.0);
    add_that_node(1, 0.0, 0.0, 1.0);
    add_that_node(2, 1.0, 0.0, 0.0);
    add_that_node(3, 0.0, 1.0, 0.0);
    add_that_node(4, 0.0, 1.0, 1.0);
    add_that_node(5, 1.0, 1.0, 0.0);

    RSS(ref_cell_add(ref_grid_pri(ref_grid), local, &cell), "add prism");
  }

  RSS(ref_node_initialize_n_global(ref_node, nnodesg), "init glob");

  return REF_SUCCESS;
}